

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::CheckFreeBitVector
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,bool isCollecting)

{
  SmallHeapBlockBitVector *this_00;
  ulong *puVar1;
  ushort uVar2;
  code *pcVar3;
  anon_class_24_3_3b104623 fn;
  ulong uVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BVIndex BVar7;
  uint uVar8;
  uint uVar9;
  SmallHeapBlockBitVector *pSVar10;
  undefined4 *puVar11;
  FreeObject *this_01;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_02;
  long lVar12;
  ulong uVar13;
  undefined7 in_register_00000031;
  FreeObject *pFStack_88;
  SmallHeapBlockBitVector temp;
  SmallHeapBlockBitVector *local_40;
  SmallHeapBlockBitVector *free;
  uint verifyFreeCount;
  
  if (((int)CONCAT71(in_register_00000031,isCollecting) == 0) &&
     ((*(this->super_HeapBlock)._vptr_HeapBlock[0x10])(this), pFStack_88 != this->freeObjectList)) {
    CheckDebugFreeBitVector(this,false);
    return;
  }
  this_00 = &this->freeBits;
  temp.data[1].word = 0;
  temp.data[2].word = 0;
  pFStack_88 = (FreeObject *)0x0;
  temp.data[0].word = 0;
  local_40 = this_00;
  js_memcpy_s(&pFStack_88,0x20,this_00,0x20);
  pSVar10 = GetInvalidBitVector(this);
  lVar12 = 0;
  do {
    puVar1 = (ulong *)((long)(temp.data + -1) + lVar12);
    *puVar1 = *puVar1 & *(ulong *)((long)&pSVar10->data[0].word + lVar12);
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x20);
  if (pFStack_88 == (FreeObject *)0x0) {
    uVar4 = 0;
    do {
      uVar13 = uVar4;
      if (uVar13 == 3) break;
      uVar4 = uVar13 + 1;
    } while (temp.data[uVar13].word == 0);
    if (uVar13 < 3) goto LAB_006b0c28;
  }
  else {
LAB_006b0c28:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x71d,"(temp.IsAllClear())","temp.IsAllClear()");
    if (!bVar5) goto LAB_006b1060;
    *puVar11 = 0;
  }
  free._4_4_ = 0;
  this_01 = this->freeObjectList;
  if (this_01 != (FreeObject *)0x0) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (((ulong)this_01 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar5) goto LAB_006b1060;
        *puVar11 = 0;
      }
      uVar8 = (uint)((ulong)this_01 >> 4) & 0xff;
      bVar5 = IsValidBitIndex(this,uVar8);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x724,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
        if (!bVar5) goto LAB_006b1060;
        *puVar11 = 0;
      }
      BVar6 = BVStatic<256UL>::Test(&this->debugFreeBits,uVar8);
      if (BVar6 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x725,"(this->GetDebugFreeBitVector()->Test(bitIndex))",
                           "this->GetDebugFreeBitVector()->Test(bitIndex)");
        if (!bVar5) goto LAB_006b1060;
        *puVar11 = 0;
      }
      BVar6 = BVStatic<256UL>::Test(local_40,uVar8);
      if (BVar6 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x726,"(free->Test(bitIndex))","free->Test(bitIndex)");
        if (!bVar5) goto LAB_006b1060;
        *puVar11 = 0;
      }
      free._4_4_ = free._4_4_ + 1;
      this_01 = FreeObject::GetNext(this_01);
    } while (this_01 != (FreeObject *)0x0);
  }
  BVar7 = BVStatic<256UL>::Count(&this->debugFreeBits);
  if (BVar7 != free._4_4_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x72b,"(this->GetDebugFreeBitVector()->Count() == verifyFreeCount)",
                       "this->GetDebugFreeBitVector()->Count() == verifyFreeCount");
    if (!bVar5) goto LAB_006b1060;
    *puVar11 = 0;
  }
  uVar2 = this->freeCount;
  BVar7 = BVStatic<256UL>::Count(this_00);
  if (BVar7 != uVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x72c,"(this->freeCount == this->GetFreeBitVector()->Count())",
                       "this->freeCount == this->GetFreeBitVector()->Count()");
    if (!bVar5) goto LAB_006b1060;
    *puVar11 = 0;
  }
  uVar8 = (uint)(this->super_HeapBlock).heapBlockType;
  if ((uVar8 < 0xb) && ((0x528U >> (uVar8 & 0x1f) & 1) != 0)) {
    this_02 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>(&this->super_HeapBlock);
    fn.free = &local_40;
    fn.this = this;
    fn.verifyFreeCount = (uint *)((long)&free + 4);
    SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::CheckFreeBitVector(bool)::_lambda(unsigned_int)_1_>
              (this_02,fn);
    uVar9 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
            CheckDisposedObjectFreeBitVector(this_02);
    free._4_4_ = free._4_4_ + uVar9;
  }
  if (free._4_4_ != this->freeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x73f,"(verifyFreeCount == this->freeCount)",
                       "verifyFreeCount == this->freeCount");
    if (!bVar5) goto LAB_006b1060;
    *puVar11 = 0;
  }
  if (this->lastFreeCount < free._4_4_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x740,"(verifyFreeCount <= this->lastFreeCount)",
                       "verifyFreeCount <= this->lastFreeCount");
    if (!bVar5) goto LAB_006b1060;
    *puVar11 = 0;
  }
  if (this->freeObjectList != this->lastFreeObjectHead) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x741,"(this->IsFreeBitsValid())","this->IsFreeBitsValid()");
    if (!bVar5) {
LAB_006b1060:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar11 = 0;
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::CheckFreeBitVector(bool isCollecting)
{
    // during collection, the heap block has the current info when we are verifying
    if (!isCollecting)
    {
        FreeObject * freeObjectList;
        this->GetFreeObjectListOnAllocator(&freeObjectList);
        if (freeObjectList != this->freeObjectList)
        {
            // allocator has the current info and if we have already allocated some memory,
            // the free bit vector isn't really correct, so we can't verify it.
            // Just verify the debug free bit vector
            this->CheckDebugFreeBitVector(false);
            return;
        }
    }

    SmallHeapBlockBitVector * free = this->GetFreeBitVector();

    // Shouldn't be any invalid bits set in the free bit vector
    SmallHeapBlockBitVector temp;
    temp.Copy(free);
    temp.And(this->GetInvalidBitVector());
    Assert(temp.IsAllClear());

    uint verifyFreeCount = 0;
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        uint bitIndex = GetAddressBitIndex(freeObject);
        Assert(IsValidBitIndex(bitIndex));
        Assert(this->GetDebugFreeBitVector()->Test(bitIndex));
        Assert(free->Test(bitIndex));
        verifyFreeCount++;

        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == verifyFreeCount);
    Assert(this->freeCount == this->GetFreeBitVector()->Count());

    if (this->IsAnyFinalizableBlock())
    {
        auto finalizableBlock = this->AsFinalizableBlock<TBlockAttributes>();

        // Include pending dispose objects
        finalizableBlock->ForEachPendingDisposeObject([&] (uint index) {
            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));
            verifyFreeCount++;
        });

        // Include disposed objects
        verifyFreeCount += finalizableBlock->CheckDisposedObjectFreeBitVector();
    }

    Assert(verifyFreeCount == this->freeCount);
    Assert(verifyFreeCount <= this->lastFreeCount);
    Assert(this->IsFreeBitsValid());
}